

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtab.c
# Opt level: O0

void StrTab_GetPosName(strtab *p,size_t Pos,tchar_t *Out,size_t OutLen)

{
  fourcc_t *pfVar1;
  stringdef *i;
  size_t OutLen_local;
  tchar_t *Out_local;
  size_t Pos_local;
  strtab *p_local;
  
  *Out = '\0';
  if (p == (strtab *)0xfffffffffffffff8) {
    __assert_fail("&(p->Table)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/strtab.c"
                  ,99,"void StrTab_GetPosName(strtab *, size_t, tchar_t *, size_t)");
  }
  if (Pos < (p->Table)._Used >> 3) {
    if (p == (strtab *)0xfffffffffffffff8) {
      __assert_fail("&(p->Table)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/strtab.c"
                    ,0x65,"void StrTab_GetPosName(strtab *, size_t, tchar_t *, size_t)");
    }
    pfVar1 = *(fourcc_t **)((p->Table)._Begin + Pos * 8);
    FourCCToString(Out,OutLen,*pfVar1);
    stprintf_s(Out + 4,OutLen - 4,"%04X",(ulong)pfVar1[1]);
  }
  return;
}

Assistant:

void StrTab_GetPosName(strtab *p, size_t Pos, tchar_t *Out, size_t OutLen)
{
    *Out = 0;
    if (Pos < ARRAYCOUNT(p->Table,stringdef*))
    {
        stringdef *i = ARRAYBEGIN(p->Table,stringdef*)[Pos];
        FourCCToString(Out,OutLen,i->Class);
        stprintf_s(Out+4,OutLen-4,T("%04X"),i->Id);
    }
}